

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O3

char * archive_entry_fflags_text(archive_entry *entry)

{
  char cVar1;
  archive_entry *paVar2;
  archive_mstring *aes;
  wchar_t wVar3;
  int *piVar4;
  size_t sVar5;
  flag *pfVar6;
  char *pcVar7;
  char *pcVar8;
  unsigned_long bits;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  size_t __size;
  char *f;
  char *local_48;
  archive_entry *local_40;
  archive_mstring *local_38;
  
  wVar3 = archive_mstring_get_mbs(entry->archive,&entry->ae_fflags_text,&local_48);
  if (wVar3 == L'\0') {
    if (local_48 != (char *)0x0) {
      return local_48;
    }
  }
  else {
    piVar4 = __errno_location();
    if (*piVar4 == 0xc) goto LAB_00649344;
  }
  uVar11 = entry->ae_fflags_set;
  uVar12 = entry->ae_fflags_clear;
  uVar9 = uVar11 | uVar12;
  if (uVar9 != 0) {
    pcVar10 = "nosappnd";
    pfVar6 = fileflags;
    __size = 0;
    local_40 = entry;
    local_38 = &entry->ae_fflags_text;
    do {
      pfVar6 = pfVar6 + 1;
      uVar13 = pfVar6[-1].clear | pfVar6[-1].set;
      if ((uVar13 & uVar9) != 0) {
        sVar5 = strlen(pcVar10);
        __size = __size + sVar5 + 1;
        uVar9 = uVar9 & ~uVar13;
      }
      pcVar10 = pfVar6->name;
    } while (pcVar10 != (char *)0x0);
    if ((__size != 0) &&
       (pcVar10 = (char *)malloc(__size), aes = local_38, paVar2 = local_40, pcVar10 != (char *)0x0)
       ) {
      pfVar6 = fileflags;
      pcVar8 = "nosappnd";
      pcVar7 = pcVar10;
      do {
        uVar9 = pfVar6->set;
        uVar13 = pfVar6->clear;
        if ((uVar13 & uVar12) == 0 && (uVar9 & uVar11) == 0) {
          if ((uVar9 & uVar12) != 0 || (uVar13 & uVar11) != 0) goto LAB_006492b3;
        }
        else {
          pcVar8 = pcVar8 + 2;
LAB_006492b3:
          if (pcVar10 < pcVar7) {
            *pcVar7 = ',';
            pcVar7 = pcVar7 + 1;
          }
          uVar11 = uVar11 & ~(uVar13 | uVar9);
          uVar12 = uVar12 & ~(uVar13 | uVar9);
          pcVar7 = pcVar7 + -1;
          do {
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
            pcVar7[1] = cVar1;
            pcVar7 = pcVar7 + 1;
          } while (cVar1 != '\0');
        }
        pcVar8 = pfVar6[1].name;
        pfVar6 = pfVar6 + 1;
      } while (pcVar8 != (char *)0x0);
      *pcVar7 = '\0';
      archive_mstring_copy_mbs(local_38,pcVar10);
      free(pcVar10);
      wVar3 = archive_mstring_get_mbs(paVar2->archive,aes,&local_48);
      if (wVar3 == L'\0') {
        return local_48;
      }
      piVar4 = __errno_location();
      if (*piVar4 == 0xc) {
LAB_00649344:
        __archive_errx(1,"No memory");
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *
archive_entry_fflags_text(struct archive_entry *entry)
{
	const char *f;
	char *p;

	if (archive_mstring_get_mbs(entry->archive,
	    &entry->ae_fflags_text, &f) == 0) {
		if (f != NULL)
			return (f);
	} else if (errno == ENOMEM)
		__archive_errx(1, "No memory");

	if (entry->ae_fflags_set == 0  &&  entry->ae_fflags_clear == 0)
		return (NULL);

	p = ae_fflagstostr(entry->ae_fflags_set, entry->ae_fflags_clear);
	if (p == NULL)
		return (NULL);

	archive_mstring_copy_mbs(&entry->ae_fflags_text, p);
	free(p);
	if (archive_mstring_get_mbs(entry->archive,
	    &entry->ae_fflags_text, &f) == 0)
		return (f);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (NULL);
}